

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * cmSystemTools::FileExistsInParentDirectories
                   (string *__return_storage_ptr__,string *fname,string *directory,string *toplevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string dir;
  string prevDir;
  string file;
  string local_e0;
  undefined1 *local_c0;
  pointer local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  string local_a0;
  string *local_80;
  string local_78;
  char *local_58;
  undefined8 local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  undefined8 local_38;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  pcVar2 = (fname->_M_dataplus)._M_p;
  local_80 = toplevel;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + fname->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_a0);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  pcVar2 = (directory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar2,pcVar2 + directory->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_e0);
  local_c0 = &local_b0;
  local_b8 = (pointer)0x0;
  local_b0 = 0;
  paVar1 = &__return_storage_ptr__->field_2;
  do {
    sVar4 = local_e0._M_string_length;
    _Var3._M_p = local_e0._M_dataplus._M_p;
    if (((pointer)local_e0._M_string_length == local_b8) &&
       (((pointer)local_e0._M_string_length == (pointer)0x0 ||
        (iVar6 = bcmp(local_e0._M_dataplus._M_p,local_c0,local_e0._M_string_length), iVar6 == 0))))
    goto LAB_002363d4;
    local_78._M_dataplus._M_p = (pointer)sVar4;
    local_78._M_string_length = (size_type)_Var3._M_p;
    local_78.field_2._M_allocated_capacity = 0;
    local_78.field_2._8_8_ = 1;
    local_58 = "/";
    local_50 = 0;
    local_48 = local_a0._M_string_length;
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a0._M_dataplus._M_p;
    local_38 = 0;
    views._M_len = 3;
    views._M_array = (iterator)&local_78;
    cmCatViews(__return_storage_ptr__,views);
    bVar5 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    if (bVar5) goto LAB_002363e9;
    iVar6 = 3;
    if ((pointer)local_80->_M_string_length <= local_e0._M_string_length) {
      std::__cxx11::string::_M_assign((string *)&local_c0);
      cmsys::SystemTools::GetParentDirectory(&local_78,&local_e0);
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      iVar6 = 0;
    }
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
  } while (iVar6 == 0);
  if (iVar6 == 3) {
LAB_002363d4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
LAB_002363e9:
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::FileExistsInParentDirectories(
  const std::string& fname, const std::string& directory,
  const std::string& toplevel)
{
  std::string file = fname;
  cmSystemTools::ConvertToUnixSlashes(file);
  std::string dir = directory;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::string prevDir;
  while (dir != prevDir) {
    std::string path = cmStrCat(dir, "/", file);
    if (cmSystemTools::FileExists(path)) {
      return path;
    }
    if (dir.size() < toplevel.size()) {
      break;
    }
    prevDir = dir;
    dir = cmSystemTools::GetParentDirectory(dir);
  }
  return "";
}